

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::programa(Sintatico *this)

{
  Sintatico *this_local;
  
  this->line = 1;
  avancar(this);
  saltBlank(this);
  eat(this,0x27);
  identificador(this);
  eat(this,0x15);
  saltBlank(this);
  bloco(this);
  saltBlank(this);
  eat(this,0x16);
  std::operator<<((ostream *)&std::cout,"COMPILATION SUCcESS\n");
  return;
}

Assistant:

void Sintatico::programa(){
  line = 1;
  avancar();
  saltBlank();
  eat(PROGRAM);
  identificador();
  eat(PONTOVIRGULA);
  saltBlank();
  bloco();
  saltBlank();
  eat(PONTO);
  cout << "COMPILATION SUCcESS\n";
}